

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_> * __thiscall
nuraft::raft_server::get_peer_info_all(raft_server *this)

{
  bool bVar1;
  value_type *__x;
  long in_RSI;
  vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_> *in_RDI;
  ptr<peer> pp;
  peer_info pi;
  value_type entry;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range1;
  unique_lock<std::recursive_mutex> guard;
  vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_> *ret;
  raft_server *in_stack_ffffffffffffff28;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *in_stack_ffffffffffffff30;
  vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
  *in_stack_ffffffffffffff40;
  undefined1 local_90 [24];
  value_type *local_78;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *local_70;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_50;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_48;
  long local_40;
  undefined4 local_28;
  byte local_11;
  
  local_11 = 0;
  std::vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>::
  vector((vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_> *)
         0x1dfc7e);
  bVar1 = is_leader(in_stack_ffffffffffffff28);
  if (bVar1) {
    std::unique_lock<std::recursive_mutex>::unique_lock
              ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff30,
               (mutex_type *)in_stack_ffffffffffffff28);
    local_40 = in_RSI + 0x1e0;
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                  *)in_stack_ffffffffffffff28);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator*((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                 *)0x1dfd4c);
      std::pair<const_int,_std::shared_ptr<nuraft::peer>_>::pair
                (in_stack_ffffffffffffff30,
                 (pair<const_int,_std::shared_ptr<nuraft::peer>_> *)in_stack_ffffffffffffff28);
      peer_info::peer_info((peer_info *)(local_90 + 0x10));
      in_stack_ffffffffffffff40 =
           (vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
            *)local_90;
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)in_stack_ffffffffffffff30,
                 (shared_ptr<nuraft::peer> *)in_stack_ffffffffffffff28);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dfd83);
      local_90._16_4_ = peer::get_id((peer *)0x1dfd8b);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dfda3);
      __x = (value_type *)peer::get_last_accepted_log_idx((peer *)0x1dfdab);
      local_78 = __x;
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1dfdc6);
      in_stack_ffffffffffffff30 =
           (pair<const_int,_std::shared_ptr<nuraft::peer>_> *)
           peer::get_resp_timer_us((peer *)0x1dfdce);
      local_70 = in_stack_ffffffffffffff30;
      std::vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>::
      push_back(in_stack_ffffffffffffff40,__x);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1dfdfa);
      std::pair<const_int,_std::shared_ptr<nuraft::peer>_>::~pair
                ((pair<const_int,_std::shared_ptr<nuraft::peer>_> *)0x1dfe04);
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)in_stack_ffffffffffffff30);
    }
    local_11 = 1;
    local_28 = 1;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff30);
  }
  else {
    local_11 = 1;
    local_28 = 1;
  }
  if ((local_11 & 1) == 0) {
    std::vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>::
    ~vector(in_stack_ffffffffffffff40);
  }
  return in_RDI;
}

Assistant:

std::vector<raft_server::peer_info> raft_server::get_peer_info_all() const {
    std::vector<raft_server::peer_info> ret;
    if (!is_leader()) return ret;

    recur_lock(lock_);
    for (auto entry: peers_) {
        peer_info pi;
        ptr<peer> pp = entry.second;
        pi.id_ = pp->get_id();
        pi.last_log_idx_ = pp->get_last_accepted_log_idx();
        pi.last_succ_resp_us_ = pp->get_resp_timer_us();
        ret.push_back(pi);
    }
    return ret;
}